

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

Maybe<unsigned_long> __thiscall
kj::
Table<kj::_::(anonymous_namespace)::SiPair,_kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>,_kj::HashIndex<kj::_::(anonymous_namespace)::SiPairIntHasher>_>
::Impl<1UL,_false>::insert
          (Impl<1UL,_false> *this,
          Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *table,
          size_t pos,SiPair *row,uint skip)

{
  RemoveConst<kj::StringPtr> **ppRVar1;
  uint uVar2;
  uint uVar3;
  StringPtr *pSVar4;
  bool bVar5;
  uint uVar6;
  long lVar7;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar8;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *paVar9;
  uint uVar10;
  ArrayDisposer *pAVar11;
  ulong uVar12;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *paVar13;
  Maybe<unsigned_long> MVar14;
  bool success;
  bool local_71;
  Impl<1UL,_false> *local_70;
  size_t local_68;
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_table_h:450:5)>
  local_60;
  
  if (skip != 1) {
    pSVar4 = (table->rows).builder.ptr;
    lVar7 = (long)(table->rows).builder.pos - (long)pSVar4 >> 3;
    uVar2 = row->i;
    local_68 = pos;
    if ((ulong)((long)table[1].rows.builder.disposer * 2) <
        ((long)table[1].rows.builder.pos + lVar7 * -0x5555555555555555) * 3 + 3U) {
      local_70 = this;
      HashIndex<kj::_::(anonymous_namespace)::SiPairIntHasher>::rehash
                ((HashIndex<kj::_::(anonymous_namespace)::SiPairIntHasher> *)(table + 1),lVar7 + 3);
      this = local_70;
    }
    uVar6 = uVar2 * 0x8000 + ~uVar2;
    uVar6 = (uVar6 >> 0xc ^ uVar6) * 5;
    uVar6 = (uVar6 >> 4 ^ uVar6) * 0x809;
    uVar6 = uVar6 >> 0x10 ^ uVar6;
    aVar8 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)
            table[1].rows.builder.disposer;
    uVar10 = (int)aVar8.value - 1U & uVar6;
    paVar9 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)0x0;
LAB_00161fd4:
    paVar13 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)
              (&((table[1].rows.builder.endPtr)->content).ptr + uVar10);
    uVar3 = *(uint *)((long)paVar13 + 4);
    uVar12 = (ulong)uVar3;
    if (uVar3 == 1) {
      if (paVar9 == (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)0x0) {
        paVar9 = paVar13;
      }
    }
    else {
      if (uVar3 == 0) {
        if (paVar9 != (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)0x0) {
          ppRVar1 = &table[1].rows.builder.pos;
          *ppRVar1 = (RemoveConst<kj::StringPtr> *)((long)&(*ppRVar1)[-1].content.size_ + 7);
          paVar13 = paVar9;
        }
        aVar8.value = ((ulong)uVar6 | pos << 0x20) + 0x200000000;
        paVar13->value = (unsigned_long)aVar8;
        bVar5 = false;
        goto LAB_0016203d;
      }
      if ((*(uint *)paVar13 == uVar6) &&
         (uVar12 = (ulong)(uVar3 - 2), *(uint *)((long)pSVar4 + uVar12 * 0x18 + 0x10) == uVar2))
      goto LAB_0016203b;
    }
    pAVar11 = (ArrayDisposer *)((ulong)uVar10 + 1);
    uVar10 = (uint)pAVar11;
    if (pAVar11 == (ArrayDisposer *)aVar8.value) {
      uVar10 = 0;
    }
    goto LAB_00161fd4;
  }
  *this = (Impl<1UL,_false>)0x0;
  aVar8 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)pos;
LAB_00162080:
  MVar14.ptr.field_1.value = aVar8.value;
  MVar14.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar14.ptr;
LAB_0016203b:
  bVar5 = true;
LAB_0016203d:
  if (bVar5) {
    *this = (Impl<1UL,_false>)0x1;
    *(ulong *)(this + 8) = uVar12;
  }
  else {
    local_60.maybeFunc.ptr.field_1.value.success = &local_71;
    local_60.maybeFunc.ptr.isSet = true;
    local_60.maybeFunc.ptr.field_1.value.pos = &local_68;
    *this = (Impl<1UL,_false>)0x0;
    local_71 = true;
    local_60.maybeFunc.ptr.field_1.value.indexObj =
         (HashIndex<kj::_::(anonymous_namespace)::StringHasher> *)(table + 1);
    local_60.maybeFunc.ptr.field_1.value.table = table;
    local_60.maybeFunc.ptr.field_1.value.row = &row->str;
    _::
    Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.h:450:5)>
    ::~Deferred(&local_60);
    aVar8 = extraout_RDX;
  }
  goto LAB_00162080;
}

Assistant:

static kj::Maybe<size_t> insert(Table<Row, Indexes...>& table, size_t pos, Row& row, uint skip) {
    if (skip == index) {
      return Impl<index + 1>::insert(table, pos, row, skip);
    }
    auto& indexObj = get<index>(table.indexes);
    KJ_IF_SOME(existing, indexObj.insert(table.rows.asPtr(), pos, indexObj.keyForRow(row))) {
      return existing;
    }

    bool success = false;
    KJ_DEFER(if (!success) {
      indexObj.erase(table.rows.asPtr(), pos, indexObj.keyForRow(row));
    });
    auto result = Impl<index + 1>::insert(table, pos, row, skip);
    success = result == kj::none;
    return result;
  }